

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::redeclareBuiltinBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *newTypeList,TString *blockName,
          TString *instanceName,TArraySizes *arraySizes)

{
  TSymbolTable *this_00;
  ulong uVar1;
  undefined8 uVar2;
  TType *this_01;
  long lVar3;
  TVector<glslang::TArraySize> *pTVar4;
  TArraySizes *this_02;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  TSymbol *pTVar11;
  undefined4 extraout_var;
  TString *pTVar12;
  undefined4 extraout_var_01;
  ulong uVar13;
  TType *pTVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TTypeList *pTVar15;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_03;
  iterator __position;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  char *pcVar16;
  pointer pcVar17;
  char *pcVar18;
  TParseContext *pTVar19;
  TSourceLoc *pTVar20;
  _func_int **pp_Var21;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer pTVar22;
  char *pcVar23;
  bool builtIn;
  TParseContext *local_98;
  TType *local_90;
  TSourceLoc memberLoc;
  ulong local_60;
  TSymbol *local_50;
  TString *local_48;
  TArraySizes *local_40;
  TTypeList *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  local_40 = arraySizes;
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
             "built-in block redeclaration");
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,-9,0x19a,"GL_ARB_separate_shader_objects",
             "built-in block redeclaration");
  pTVar19 = (TParseContext *)blockName;
  bVar5 = std::operator!=(blockName,"gl_PerVertex");
  if (((((bVar5) &&
        (pTVar19 = (TParseContext *)blockName, bVar5 = std::operator!=(blockName,"gl_PerFragment"),
        bVar5)) &&
       (pTVar19 = (TParseContext *)blockName,
       bVar5 = std::operator!=(blockName,"gl_MeshPerVertexNV"), bVar5)) &&
      ((pTVar19 = (TParseContext *)blockName,
       bVar5 = std::operator!=(blockName,"gl_MeshPerPrimitiveNV"), bVar5 &&
       (pTVar19 = (TParseContext *)blockName,
       bVar5 = std::operator!=(blockName,"gl_MeshPerVertexEXT"), bVar5)))) &&
     (pTVar19 = (TParseContext *)blockName,
     bVar5 = std::operator!=(blockName,"gl_MeshPerPrimitiveEXT"), bVar5)) {
    pcVar23 = (blockName->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar18 = "cannot redeclare block: ";
    pcVar16 = "block declaration";
LAB_003a66a0:
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar18,pcVar16,pcVar23,UNRECOVERED_JUMPTABLE);
    return;
  }
  if (instanceName == (TString *)0x0) {
    this_00 = (this->super_TParseContextBase).symbolTable;
    iVar7 = (*((newTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    pTVar11 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var,iVar7),&builtIn,
                                 (bool *)0x0,(int *)0x0);
    iVar7 = (*((newTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    pTVar12 = (TString *)CONCAT44(extraout_var_00,iVar7);
  }
  else {
    bVar5 = builtInName(pTVar19,instanceName);
    if (!bVar5) {
      pcVar16 = (instanceName->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar18 = "cannot redeclare a built-in block with a user name";
      pcVar23 = "";
      goto LAB_003a66a0;
    }
    pTVar11 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,instanceName,&builtIn,
                                 (bool *)0x0,(int *)0x0);
    pTVar12 = instanceName;
  }
  pcVar17 = (pTVar12->_M_dataplus)._M_p;
  if (pTVar11 == (TSymbol *)0x0) {
    pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "no declaration found for redeclaration";
LAB_003a66fd:
    (*pp_Var21[0x2d])(this,loc,pcVar23,pcVar17,"");
    return;
  }
  if (builtIn == false) {
    pcVar17 = (blockName->_M_dataplus)._M_p;
    pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "can only redeclare a built-in block once, and before any use";
    goto LAB_003a66fd;
  }
  pTVar11 = TSymbolTable::copyUpDeferredInsert((this->super_TParseContextBase).symbolTable,pTVar11);
  local_50 = pTVar11;
  iVar7 = (*pTVar11->_vptr_TSymbol[0xc])(pTVar11);
  iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x38))
                    ((long *)CONCAT44(extraout_var_01,iVar7));
  if (iVar7 != 0x10) {
    pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "cannot redeclare a non block as a block";
    goto LAB_003a66fd;
  }
  if (((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
     (uVar13 = (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf),
     uVar13 != 0xf)) {
    uVar1 = *(ulong *)&(this->currentBlockQualifier).field_0x24;
    if ((~(uint)uVar1 & 0xf) == 0) {
      *(ulong *)&(this->currentBlockQualifier).field_0x24 = uVar1 & 0xfffffffffffffff0 | uVar13;
    }
    uVar13 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
    if (0xfeffffffffffffff < uVar13) {
      *(ulong *)&(this->currentBlockQualifier).field_0x1c =
           uVar13 & 0xffffffffffffff |
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xff00000000000000;
    }
    fixXfbOffsets(this,&this->currentBlockQualifier,newTypeList);
  }
  local_48 = blockName;
  iVar7 = (*pTVar11->_vptr_TSymbol[0xd])(pTVar11);
  pTVar14 = (TType *)CONCAT44(extraout_var_02,iVar7);
  local_98 = this;
  if ((this->currentBlockQualifier).layoutPassthrough == true) {
    iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
    *(undefined1 *)(CONCAT44(extraout_var_03,iVar7) + 0x2f) = 1;
    uVar2 = *(undefined8 *)&(local_98->currentBlockQualifier).field_0x8;
    iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
    *(ulong *)(CONCAT44(extraout_var_04,iVar7) + 8) =
         *(ulong *)(CONCAT44(extraout_var_04,iVar7) + 8) & 0xffffffffffffff80 |
         (ulong)((uint)uVar2 & 0x7f);
    uVar13 = *(ulong *)&(local_98->currentBlockQualifier).field_0x1c;
    iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
    *(ulong *)(CONCAT44(extraout_var_05,iVar7) + 0x1c) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar7) + 0x1c) & 0xffffffffffffff |
         uVar13 & 0xff00000000000000;
    uVar2 = *(undefined8 *)&(local_98->currentBlockQualifier).field_0x24;
    iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
    *(ulong *)(CONCAT44(extraout_var_06,iVar7) + 0x24) =
         *(ulong *)(CONCAT44(extraout_var_06,iVar7) + 0x24) & 0xfffffffffffffff0 |
         (ulong)((uint)uVar2 & 0xf);
  }
  pTVar19 = local_98;
  pTVar15 = TType::getWritableStruct(pTVar14);
  __position._M_current =
       (pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60 = 0;
  local_90 = pTVar14;
  local_38 = newTypeList;
  while (pTVar15 = TType::getStruct(pTVar14),
        __position._M_current !=
        (pTVar15->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    memberLoc.name = (TString *)0x0;
    memberLoc.string = 0;
    memberLoc.line = 0;
    memberLoc._16_8_ = memberLoc._16_8_ & 0xffffffff00000000;
    for (pTVar22 = (newTypeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar14 = local_90,
        pTVar22 !=
        (newTypeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish; pTVar22 = pTVar22 + 1) {
      iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
      iVar8 = (*pTVar22->type->_vptr_TType[6])();
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_07,iVar7),
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_08,iVar8));
      if (bVar5) {
        memberLoc.column = (pTVar22->loc).column;
        memberLoc._20_4_ = *(undefined4 *)&(pTVar22->loc).field_0x14;
        memberLoc.name = (pTVar22->loc).name;
        memberLoc.string = (pTVar22->loc).string;
        memberLoc.line = (pTVar22->loc).line;
        pTVar14 = (__position._M_current)->type;
        this_01 = pTVar22->type;
        bVar5 = TType::sameElementType(this_01,pTVar14,(int *)0x0,(int *)0x0);
        if (!bVar5) {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,"cannot redeclare block member with a different type",
                     *(undefined8 *)(CONCAT44(extraout_var_09,iVar7) + 8),"");
        }
        iVar7 = (*pTVar14->_vptr_TType[0x1d])(pTVar14);
        iVar8 = (*this_01->_vptr_TType[0x1d])(this_01);
        if ((char)iVar7 == (char)iVar8) {
          iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
          if ((((*(ulong *)(CONCAT44(extraout_var_11,iVar7) + 8) & 0x40000000000) != 0) ||
              (bVar5 = TType::sameArrayness(pTVar14,this_01), bVar5)) ||
             (iVar7 = (*pTVar14->_vptr_TType[0x1e])(pTVar14), (char)iVar7 == '\0')) {
            iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
            if (((*(ulong *)(CONCAT44(extraout_var_13,iVar7) + 8) & 0x40000000000) == 0) &&
               (iVar7 = (*this_01->_vptr_TType[0x1d])(this_01), (char)iVar7 != '\0')) {
              iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
              iVar8 = (*this_01->_vptr_TType[0xf])(this_01);
              arrayLimitCheck(pTVar19,loc,(TString *)CONCAT44(extraout_var_14,iVar7),iVar8);
            }
          }
          else {
            iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
            (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (pTVar19,&memberLoc,"cannot change array size of redeclared block member",
                       *(undefined8 *)(CONCAT44(extraout_var_12,iVar7) + 8),"");
          }
        }
        else {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,"cannot change arrayness of redeclared block member",
                     *(undefined8 *)(CONCAT44(extraout_var_10,iVar7) + 8),"");
        }
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        if (((*(ulong *)(CONCAT44(extraout_var_15,iVar7) + 8) & 0x40000000000) == 0) ||
           (iVar7 = (*this_01->_vptr_TType[0xb])(this_01),
           (*(ulong *)(CONCAT44(extraout_var_16,iVar7) + 8) & 0x40000000000) != 0)) {
          iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
          if (((*(ulong *)(CONCAT44(extraout_var_18,iVar7) + 8) & 0x40000000000) == 0) &&
             (iVar7 = (*this_01->_vptr_TType[0xb])(this_01),
             (*(ulong *)(CONCAT44(extraout_var_19,iVar7) + 8) & 0x40000000000) != 0)) {
            iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
            pcVar23 = *(char **)(CONCAT44(extraout_var_27,iVar7) + 8);
            pp_Var21 = (pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pTVar20 = &memberLoc;
            pcVar16 = "cannot add perviewNV qualifier to redeclared block member";
            goto LAB_003a6171;
          }
          iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
          if ((*(ulong *)(CONCAT44(extraout_var_20,iVar7) + 8) & 0x40000000000) != 0) {
            iVar7 = (*pTVar14->_vptr_TType[0x14])(pTVar14);
            lVar3 = *(long *)(CONCAT44(extraout_var_21,iVar7) + 8);
            iVar8 = 0;
            iVar7 = 0;
            if (lVar3 != 0) {
              iVar7 = (int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 4);
            }
            iVar9 = (*this_01->_vptr_TType[0x13])(this_01);
            lVar3 = *(long *)(CONCAT44(extraout_var_22,iVar9) + 8);
            if (lVar3 != 0) {
              iVar8 = (int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 4);
            }
            if (iVar7 == iVar8) {
              iVar7 = (*this_01->_vptr_TType[0x1f])(this_01);
              pTVar19 = local_98;
              if (((char)iVar7 != '\0') ||
                 (iVar7 = (*this_01->_vptr_TType[0xf])(this_01),
                 iVar7 == (pTVar19->resources).maxMeshViewCountNV)) {
                iVar7 = (*this_01->_vptr_TType[0x13])(this_01);
                lVar3 = *(long *)(CONCAT44(extraout_var_23,iVar7) + 8);
                if ((lVar3 != 0) &&
                   ((*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) & 0xffffffff0U) == 0x20)) {
                  iVar7 = (*this_01->_vptr_TType[0x13])(this_01);
                  uVar10 = TSmallArrayVector::getDimSize
                                     ((TSmallArrayVector *)CONCAT44(extraout_var_24,iVar7),1);
                  iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
                  arrayLimitCheck(pTVar19,&memberLoc,(TString *)CONCAT44(extraout_var_25,iVar7),
                                  uVar10);
                  iVar7 = (*pTVar14->_vptr_TType[0x14])(pTVar14);
                  TSmallArrayVector::setDimSize
                            ((TSmallArrayVector *)CONCAT44(extraout_var_26,iVar7),1,uVar10);
                }
                goto LAB_003a6181;
              }
              pp_Var21 = (pTVar19->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar16 = 
              "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized";
              pcVar23 = "[]";
              pTVar20 = loc;
            }
            else {
              iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
              pcVar23 = *(char **)(CONCAT44(extraout_var_28,iVar7) + 8);
              pp_Var21 = (local_98->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pTVar20 = &memberLoc;
              pcVar16 = "cannot change arrayness of redeclared block member";
              pTVar19 = local_98;
            }
            goto LAB_003a6171;
          }
        }
        else {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          pcVar23 = *(char **)(CONCAT44(extraout_var_17,iVar7) + 8);
          pp_Var21 = (pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar16 = "missing perviewNV qualifier to redeclared block member";
          pTVar20 = &memberLoc;
LAB_003a6171:
          (*pp_Var21[0x2d])(pTVar19,pTVar20,pcVar16,pcVar23,"");
        }
LAB_003a6181:
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        if ((*(ulong *)(CONCAT44(extraout_var_29,iVar7) + 8) & 0x20000000000) == 0) {
LAB_003a61b4:
          iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
          if ((*(ulong *)(CONCAT44(extraout_var_31,iVar7) + 8) & 0x20000000000) == 0) {
            iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
            pcVar23 = "cannot add perprimitiveNV qualifier to redeclared block member";
            if ((*(ulong *)(CONCAT44(extraout_var_32,iVar7) + 8) & 0x20000000000) != 0)
            goto LAB_003a61da;
          }
        }
        else {
          iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
          pcVar23 = "missing perprimitiveNV qualifier to redeclared block member";
          if ((*(ulong *)(CONCAT44(extraout_var_30,iVar7) + 8) & 0x20000000000) != 0)
          goto LAB_003a61b4;
LAB_003a61da:
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,pcVar23,*(undefined8 *)(CONCAT44(extraout_var_33,iVar7) + 8)
                     ,"");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        if ((*(uint *)(CONCAT44(extraout_var_34,iVar7) + 0xc) & 0x3ffc000) != 0) {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,"cannot add memory qualifier to redeclared block member",
                     *(undefined8 *)(CONCAT44(extraout_var_35,iVar7) + 8),"");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        bVar5 = TQualifier::hasNonXfbLayout((TQualifier *)CONCAT44(extraout_var_36,iVar7));
        newTypeList = local_38;
        if (bVar5) {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,"cannot add non-XFB layout to redeclared block member",
                     *(undefined8 *)(CONCAT44(extraout_var_37,iVar7) + 8),"");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        if ((*(byte *)(CONCAT44(extraout_var_38,iVar7) + 0xd) & 0x10) != 0) {
          iVar7 = (*(__position._M_current)->type->_vptr_TType[6])();
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,"cannot add patch to redeclared block member",
                     *(undefined8 *)(CONCAT44(extraout_var_39,iVar7) + 8),"");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        if (((~*(uint *)(CONCAT44(extraout_var_40,iVar7) + 0x24) & 0xf) != 0) &&
           (iVar7 = (*this_01->_vptr_TType[0xb])(this_01),
           ((*(uint *)&(pTVar19->currentBlockQualifier).field_0x24 ^
            *(uint *)(CONCAT44(extraout_var_41,iVar7) + 0x24)) & 0xf) != 0)) {
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,
                     "member cannot contradict block (or what block inherited from global)",
                     "xfb_buffer","");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        if ((*(ulong *)(CONCAT44(extraout_var_42,iVar7) + 0x1c) < 0xff00000000000000) &&
           (iVar7 = (*this_01->_vptr_TType[0xb])(this_01),
           0xffffffffffffff <
           (*(ulong *)&(pTVar19->currentBlockQualifier).field_0x1c ^
           *(ulong *)(CONCAT44(extraout_var_43,iVar7) + 0x1c)))) {
          (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (pTVar19,&memberLoc,
                     "member cannot contradict block (or what block inherited from global)",
                     "xfb_stream","");
        }
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_44,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_45,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_45,iVar7) + 8) & 0xffffffffdfffffff |
             (ulong)((uint)uVar2 & 0x20000000);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar13 = *(ulong *)(CONCAT44(extraout_var_46,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_47,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_47,iVar7) + 8) & 0xffffdfffffffffff |
             uVar13 & 0x200000000000;
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_48,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_49,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_49,iVar7) + 8) & 0xffffffffefffffff |
             (ulong)((uint)uVar2 & 0x10000000);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar13 = *(ulong *)(CONCAT44(extraout_var_50,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_51,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_51,iVar7) + 8) & 0xffffffefffffffff |
             uVar13 & 0x1000000000;
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_52,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_53,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_53,iVar7) + 8) & 0xffffffffbfffffff |
             (ulong)((uint)uVar2 & 0x40000000);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_54,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_55,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_55,iVar7) + 8) & 0xffffffff7fffffff |
             (ulong)((uint)uVar2 & 0x80000000);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar13 = *(ulong *)(CONCAT44(extraout_var_56,iVar7) + 8);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_57,iVar7) + 8) =
             *(ulong *)(CONCAT44(extraout_var_57,iVar7) + 8) & 0xffffffdfffffffff |
             uVar13 & 0x2000000000;
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_58,iVar7) + 0x24);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_59,iVar7) + 0x24) =
             *(ulong *)(CONCAT44(extraout_var_59,iVar7) + 0x24) & 0xffffffff8003ffff |
             (ulong)((uint)uVar2 & 0x7ffc0000);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_60,iVar7) + 0x24);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_61,iVar7) + 0x24) =
             *(ulong *)(CONCAT44(extraout_var_61,iVar7) + 0x24) & 0xfffffffffffffff0 |
             (ulong)((uint)uVar2 & 0xf);
        iVar7 = (*this_01->_vptr_TType[0xb])(this_01);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_62,iVar7) + 0x24);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        *(ulong *)(CONCAT44(extraout_var_63,iVar7) + 0x24) =
             *(ulong *)(CONCAT44(extraout_var_63,iVar7) + 0x24) & 0xfffffffffffc000f |
             (ulong)((uint)uVar2 & 0x3fff0);
        iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
        pTVar19 = local_98;
        if ((*(uint *)(CONCAT44(extraout_var_64,iVar7) + 0x24) & 0x7ffc0000) != 0x3c0000) {
          uVar2 = *(undefined8 *)&(local_98->currentBlockQualifier).field_0x24;
          iVar7 = (*local_90->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_65,iVar7) + 0x24) =
               *(ulong *)(CONCAT44(extraout_var_65,iVar7) + 0x24) & 0xfffffffffffffff0 |
               (ulong)((uint)uVar2 & 0xf);
          uVar2 = *(undefined8 *)&(pTVar19->currentBlockQualifier).field_0x24;
          iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
          *(ulong *)(CONCAT44(extraout_var_66,iVar7) + 0x24) =
               *(ulong *)(CONCAT44(extraout_var_66,iVar7) + 0x24) & 0xfffffffffffffff0 |
               (ulong)((uint)uVar2 & 0xf);
        }
        iVar7 = (*pTVar14->_vptr_TType[0x1f])(pTVar14);
        pTVar19 = local_98;
        if (((char)iVar7 != '\0') &&
           (iVar7 = (*this_01->_vptr_TType[0x1e])(this_01), (char)iVar7 != '\0')) {
          iVar7 = (*this_01->_vptr_TType[0xf])(this_01);
          TType::changeOuterArraySize(pTVar14,iVar7);
        }
        local_60 = local_60 + 1;
        layoutTypeCheck(pTVar19,loc,pTVar14);
        goto LAB_003a6658;
      }
    }
    if (instanceName == (TString *)0x0) {
      (*(__position._M_current)->type->_vptr_TType[2])();
LAB_003a6658:
      __position._M_current = __position._M_current + 1;
      pTVar14 = local_90;
    }
    else {
      this_03 = &TType::getWritableStruct(local_90)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      __position = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   erase(this_03,__position._M_current);
    }
  }
  if (0 < (pTVar19->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) {
    uVar13 = *(ulong *)&(pTVar19->currentBlockQualifier).field_0x1c;
    iVar7 = (*pTVar14->_vptr_TType[10])(pTVar14);
    *(ulong *)(CONCAT44(extraout_var_67,iVar7) + 0x1c) =
         *(ulong *)(CONCAT44(extraout_var_67,iVar7) + 0x1c) & 0xffffffffffffff |
         uVar13 & 0xff00000000000000;
  }
  pTVar12 = local_48;
  if (local_60 <
      (ulong)((long)(newTypeList->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(newTypeList->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (pTVar19,loc,"block redeclaration has extra members",(local_48->_M_dataplus)._M_p,"");
  }
  iVar7 = (*pTVar14->_vptr_TType[0x1d])(pTVar14);
  this_02 = local_40;
  pcVar23 = "cannot change arrayness of redeclared block";
  if ((local_40 != (TArraySizes *)0x0) == (bool)(char)iVar7) {
    iVar7 = (*pTVar14->_vptr_TType[0x1d])();
    if ((this_02 != (TArraySizes *)0x0) && ((char)iVar7 != '\0')) {
      iVar7 = (*local_90->_vptr_TType[0x14])();
      lVar3 = *(long *)(CONCAT44(extraout_var_68,iVar7) + 8);
      iVar7 = 0;
      iVar8 = 0;
      if (lVar3 != 0) {
        iVar8 = (int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 4);
      }
      pTVar4 = (this_02->sizes).sizes;
      if (pTVar4 != (TVector<glslang::TArraySize> *)0x0) {
        iVar7 = (int)((ulong)((long)(pTVar4->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar4->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      if (iVar8 != iVar7) goto LAB_003a67ab;
    }
    pTVar14 = local_90;
    iVar7 = (*local_90->_vptr_TType[0x1d])(local_90);
    if ((char)iVar7 == '\0') goto LAB_003a68d3;
    bVar5 = TArraySizes::isSized(this_02);
    if ((!bVar5) && (iVar7 = (*pTVar14->_vptr_TType[0x1e])(pTVar14), (char)iVar7 != '\0')) {
      iVar7 = (*pTVar14->_vptr_TType[0xf])(pTVar14);
      TArraySizes::changeOuterSize(this_02,iVar7);
    }
    iVar7 = (*pTVar14->_vptr_TType[0x1e])(pTVar14);
    if (((char)iVar7 == '\0') && (bVar5 = TArraySizes::isSized(this_02), bVar5)) {
      uVar10 = TSmallArrayVector::frontSize(&this_02->sizes);
      TType::changeOuterArraySize(pTVar14,uVar10);
    }
    iVar7 = (*pTVar14->_vptr_TType[0x1e])(pTVar14);
    if ((char)iVar7 == '\0') goto LAB_003a68d3;
    iVar7 = (*pTVar14->_vptr_TType[0x14])(pTVar14);
    bVar5 = TSmallArrayVector::operator!=
                      ((TSmallArrayVector *)CONCAT44(extraout_var_69,iVar7),&this_02->sizes);
    if (!bVar5) goto LAB_003a68d3;
    pcVar23 = "cannot change array size of redeclared block";
  }
LAB_003a67ab:
  (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (pTVar19,loc,pcVar23,(pTVar12->_M_dataplus)._M_p,"");
LAB_003a68d3:
  pTVar11 = local_50;
  TSymbolTable::insert((pTVar19->super_TParseContextBase).symbolTable,local_50);
  layoutObjectCheck(pTVar19,loc,pTVar11);
  iVar7 = (*pTVar11->_vptr_TSymbol[0xc])(pTVar11);
  bVar5 = isIoResizeArray(pTVar19,(TType *)CONCAT44(extraout_var_70,iVar7));
  if (bVar5) {
    std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::push_back
              (&(pTVar19->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
               &local_50);
    checkIoArraysConsistency(pTVar19,loc,true);
    pTVar11 = local_50;
  }
  else {
    iVar7 = (*pTVar11->_vptr_TSymbol[0xc])(pTVar11);
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_71,iVar7) + 0xe8))
                      ((long *)CONCAT44(extraout_var_71,iVar7));
    if (cVar6 != '\0') {
      iVar7 = (*pTVar11->_vptr_TSymbol[0xd])(pTVar11);
      fixIoArraySize(pTVar19,loc,(TType *)CONCAT44(extraout_var_72,iVar7));
    }
  }
  (*(pTVar19->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
            (pTVar19,pTVar11);
  return;
}

Assistant:

void TParseContext::redeclareBuiltinBlock(const TSourceLoc& loc, TTypeList& newTypeList, const TString& blockName,
    const TString* instanceName, TArraySizes* arraySizes)
{
    const char* feature = "built-in block redeclaration";
    profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
    profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_separate_shader_objects, feature);

    if (blockName != "gl_PerVertex" && blockName != "gl_PerFragment" &&
        blockName != "gl_MeshPerVertexNV" && blockName != "gl_MeshPerPrimitiveNV" &&
        blockName != "gl_MeshPerVertexEXT" && blockName != "gl_MeshPerPrimitiveEXT") {
        error(loc, "cannot redeclare block: ", "block declaration", blockName.c_str());
        return;
    }

    // Redeclaring a built-in block...

    if (instanceName && ! builtInName(*instanceName)) {
        error(loc, "cannot redeclare a built-in block with a user name", instanceName->c_str(), "");
        return;
    }

    // Blocks with instance names are easy to find, lookup the instance name,
    // Anonymous blocks need to be found via a member.
    bool builtIn;
    TSymbol* block;
    if (instanceName)
        block = symbolTable.find(*instanceName, &builtIn);
    else
        block = symbolTable.find(newTypeList.front().type->getFieldName(), &builtIn);

    // If the block was not found, this must be a version/profile/stage
    // that doesn't have it, or the instance name is wrong.
    const char* errorName = instanceName ? instanceName->c_str() : newTypeList.front().type->getFieldName().c_str();
    if (! block) {
        error(loc, "no declaration found for redeclaration", errorName, "");
        return;
    }
    // Built-in blocks cannot be redeclared more than once, which if happened,
    // we'd be finding the already redeclared one here, rather than the built in.
    if (! builtIn) {
        error(loc, "can only redeclare a built-in block once, and before any use", blockName.c_str(), "");
        return;
    }

    // Copy the block to make a writable version, to insert into the block table after editing.
    block = symbolTable.copyUpDeferredInsert(block);

    if (block->getType().getBasicType() != EbtBlock) {
        error(loc, "cannot redeclare a non block as a block", errorName, "");
        return;
    }

    // Fix XFB stuff up, it applies to the order of the redeclaration, not
    // the order of the original members.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
        if (!currentBlockQualifier.hasXfbBuffer())
            currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
        if (!currentBlockQualifier.hasStream())
            currentBlockQualifier.layoutStream = globalOutputDefaults.layoutStream;
        fixXfbOffsets(currentBlockQualifier, newTypeList);
    }

    // Edit and error check the container against the redeclaration
    //  - remove unused members
    //  - ensure remaining qualifiers/types match

    TType& type = block->getWritableType();

    // if gl_PerVertex is redeclared for the purpose of passing through "gl_Position"
    // for passthrough purpose, the redeclared block should have the same qualifers as
    // the current one
    if (currentBlockQualifier.layoutPassthrough) {
        type.getQualifier().layoutPassthrough = currentBlockQualifier.layoutPassthrough;
        type.getQualifier().storage = currentBlockQualifier.storage;
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
        type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
    }

    TTypeList::iterator member = type.getWritableStruct()->begin();
    size_t numOriginalMembersFound = 0;
    while (member != type.getStruct()->end()) {
        // look for match
        bool found = false;
        TTypeList::const_iterator newMember;
        TSourceLoc memberLoc;
        memberLoc.init();
        for (newMember = newTypeList.begin(); newMember != newTypeList.end(); ++newMember) {
            if (member->type->getFieldName() == newMember->type->getFieldName()) {
                found = true;
                memberLoc = newMember->loc;
                break;
            }
        }

        if (found) {
            ++numOriginalMembersFound;
            // - ensure match between redeclared members' types
            // - check for things that can't be changed
            // - update things that can be changed
            TType& oldType = *member->type;
            const TType& newType = *newMember->type;
            if (! newType.sameElementType(oldType))
                error(memberLoc, "cannot redeclare block member with a different type", member->type->getFieldName().c_str(), "");
            if (oldType.isArray() != newType.isArray())
                error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && ! oldType.sameArrayness(newType) && oldType.isSizedArray())
                error(memberLoc, "cannot change array size of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.isArray())
                arrayLimitCheck(loc, member->type->getFieldName(), newType.getOuterArraySize());
            if (oldType.getQualifier().isPerView() && ! newType.getQualifier().isPerView())
                error(memberLoc, "missing perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.getQualifier().isPerView())
                error(memberLoc, "cannot add perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (newType.getQualifier().isPerView()) {
                if (oldType.getArraySizes()->getNumDims() != newType.getArraySizes()->getNumDims())
                    error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
                else if (! newType.isUnsizedArray() && newType.getOuterArraySize() != resources.maxMeshViewCountNV)
                    error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
                else if (newType.getArraySizes()->getNumDims() == 2) {
                    int innerDimSize = newType.getArraySizes()->getDimSize(1);
                    arrayLimitCheck(memberLoc, member->type->getFieldName(), innerDimSize);
                    oldType.getArraySizes()->setDimSize(1, innerDimSize);
                }
            }
            if (oldType.getQualifier().isPerPrimitive() && ! newType.getQualifier().isPerPrimitive())
                error(memberLoc, "missing perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerPrimitive() && newType.getQualifier().isPerPrimitive())
                error(memberLoc, "cannot add perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().isMemory())
                error(memberLoc, "cannot add memory qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasNonXfbLayout())
                error(memberLoc, "cannot add non-XFB layout to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().patch)
                error(memberLoc, "cannot add patch to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasXfbBuffer() &&
                newType.getQualifier().layoutXfbBuffer != currentBlockQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
            if (newType.getQualifier().hasStream() &&
                newType.getQualifier().layoutStream != currentBlockQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_stream", "");
            oldType.getQualifier().centroid = newType.getQualifier().centroid;
            oldType.getQualifier().sample = newType.getQualifier().sample;
            oldType.getQualifier().invariant = newType.getQualifier().invariant;
            oldType.getQualifier().noContraction = newType.getQualifier().noContraction;
            oldType.getQualifier().smooth = newType.getQualifier().smooth;
            oldType.getQualifier().flat = newType.getQualifier().flat;
            oldType.getQualifier().nopersp = newType.getQualifier().nopersp;
            oldType.getQualifier().layoutXfbOffset = newType.getQualifier().layoutXfbOffset;
            oldType.getQualifier().layoutXfbBuffer = newType.getQualifier().layoutXfbBuffer;
            oldType.getQualifier().layoutXfbStride = newType.getQualifier().layoutXfbStride;
            if (oldType.getQualifier().layoutXfbOffset != TQualifier::layoutXfbBufferEnd) {
                // If any member has an xfb_offset, then the block's xfb_buffer inherents current xfb_buffer,
                // and for xfb processing, the member needs it as well, along with xfb_stride.
                type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
                oldType.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
            }
            if (oldType.isUnsizedArray() && newType.isSizedArray())
                oldType.changeOuterArraySize(newType.getOuterArraySize());

            //  check and process the member's type, which will include managing xfb information
            layoutTypeCheck(loc, oldType);

            // go to next member
            ++member;
        } else {
            // For missing members of anonymous blocks that have been redeclared,
            // hide the original (shared) declaration.
            // Instance-named blocks can just have the member removed.
            if (instanceName)
                member = type.getWritableStruct()->erase(member);
            else {
                member->type->hideMember();
                ++member;
            }
        }
    }

    if (spvVersion.vulkan > 0) {
        // ...then streams apply to built-in blocks, instead of them being only on stream 0
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
    }

    if (numOriginalMembersFound < newTypeList.size())
        error(loc, "block redeclaration has extra members", blockName.c_str(), "");
    if (type.isArray() != (arraySizes != nullptr) ||
        (type.isArray() && arraySizes != nullptr && type.getArraySizes()->getNumDims() != arraySizes->getNumDims()))
        error(loc, "cannot change arrayness of redeclared block", blockName.c_str(), "");
    else if (type.isArray()) {
        // At this point, we know both are arrays and both have the same number of dimensions.

        // It is okay for a built-in block redeclaration to be unsized, and keep the size of the
        // original block declaration.
        if (!arraySizes->isSized() && type.isSizedArray())
            arraySizes->changeOuterSize(type.getOuterArraySize());

        // And, okay to be giving a size to the array, by the redeclaration
        if (!type.isSizedArray() && arraySizes->isSized())
            type.changeOuterArraySize(arraySizes->getOuterSize());

        // Now, they must match in all dimensions.
        if (type.isSizedArray() && *type.getArraySizes() != *arraySizes)
            error(loc, "cannot change array size of redeclared block", blockName.c_str(), "");
    }

    symbolTable.insert(*block);

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, *block);

    // Tracking for implicit sizing of array
    if (isIoResizeArray(block->getType())) {
        ioArraySymbolResizeList.push_back(block);
        checkIoArraysConsistency(loc, true);
    } else if (block->getType().isArray())
        fixIoArraySize(loc, block->getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(*block);
}